

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O3

int Test_SUNLinSolSetPreconditioner
              (SUNLinearSolver S,void *Pdata,SUNPSetupFn PSetup,SUNPSolveFn PSolve,int myid)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = SUNLinSolSetPreconditioner();
  sync_device();
  if (uVar1 == 0) {
    iVar2 = 0;
    if (myid == 0) {
      puts("    PASSED test -- SUNLinSolSetPreconditioner ");
      iVar2 = 0;
      if (print_time != 0) {
        printf("    SUNLinSolSetPreconditioner Time: %22.15e \n \n",0);
      }
    }
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetPreconditioner returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)(uint)myid);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Test_SUNLinSolSetPreconditioner(SUNLinearSolver S, void* Pdata,
                                    SUNPSetupFn PSetup, SUNPSolveFn PSolve,
                                    int myid)
{
  int failure;
  double start_time, stop_time;

  /* try calling SetPreconditioner routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetPreconditioner(S, Pdata, PSetup, PSolve);
  sync_device();
  stop_time = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetPreconditioner returned %d on Proc "
           "%d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetPreconditioner \n");
    PRINT_TIME("    SUNLinSolSetPreconditioner Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}